

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseParser.cpp
# Opt level: O2

void __thiscall phpconvert::BaseParser::~BaseParser(BaseParser *this)

{
  this->_vptr_BaseParser = (_func_int **)&PTR__BaseParser_00143c40;
  std::__cxx11::string::~string((string *)&this->outputDir);
  std::__cxx11::string::~string((string *)&this->sourceDir);
  return;
}

Assistant:

BaseParser::~BaseParser() {
    }